

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string **p)

{
  byte *pbVar1;
  bool bVar2;
  string *buffer;
  int64 iVar3;
  uint first_byte_or_zero;
  
  buffer = *p;
  if (buffer == (string *)&fixed_address_empty_string_abi_cxx11_) {
    buffer = (string *)operator_new(0x20);
    (buffer->_M_dataplus)._M_p = (pointer)&buffer->field_2;
    buffer->_M_string_length = 0;
    (buffer->field_2)._M_local_buf[0] = '\0';
    *p = buffer;
  }
  pbVar1 = input->buffer_;
  if (pbVar1 < input->buffer_end_) {
    first_byte_or_zero = (uint)*pbVar1;
    if (-1 < (char)*pbVar1) {
      input->buffer_ = pbVar1 + 1;
      goto LAB_00287545;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar3 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  first_byte_or_zero = (uint)iVar3;
  if (iVar3 < 0) {
    return false;
  }
LAB_00287545:
  bVar2 = io::CodedInputStream::ReadString(input,buffer,first_byte_or_zero);
  return bVar2;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input, std::string** p) {
  if (*p == &GetEmptyStringAlreadyInited()) {
    *p = new std::string();
  }
  return ReadBytesToString(input, *p);
}